

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O0

void Npn_ManSaveOne(uint *puTruth,int nVars)

{
  int iVar1;
  word wVar2;
  word uTruth;
  int nVars_local;
  uint *puTruth_local;
  
  wVar2 = *(word *)puTruth;
  if ((-1 < nVars) && (nVars < 7)) {
    if (pNpnMan == (Npn_Man_t *)0x0) {
      Abc_Print(1,"Creating new table with 0 entries.\n");
      pNpnMan = Npn_ManStart((char *)0x0);
    }
    iVar1 = Npn_TruthIsMinBase(wVar2);
    if (iVar1 != 0) {
      wVar2 = Npn_TruthPadWord(wVar2,nVars);
      wVar2 = Npn_TruthCanon(wVar2,6,(int *)0x0);
      Npn_ManAdd(pNpnMan,wVar2);
    }
    return;
  }
  __assert_fail("nVars >= 0 && nVars <= 6",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                ,0x2cd,"void Npn_ManSaveOne(unsigned int *, int)");
}

Assistant:

void Npn_ManSaveOne( unsigned * puTruth, int nVars )
{
    word uTruth = (((word)puTruth[1]) << 32) | (word)puTruth[0];
    assert( nVars >= 0 && nVars <= 6 );
    if ( pNpnMan == NULL )
    {
        Abc_Print( 1, "Creating new table with 0 entries.\n" );
        pNpnMan = Npn_ManStart( NULL );
    }
    // skip truth tables that do not depend on some vars
    if ( !Npn_TruthIsMinBase( uTruth ) )
        return;
    // extend truth table to look like 6-input
    uTruth = Npn_TruthPadWord( uTruth, nVars );
    // semi(!)-NPN-canonize the truth table
    uTruth = Npn_TruthCanon( uTruth, 6, NULL );
    // add to storage
    Npn_ManAdd( pNpnMan, uTruth );
}